

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTryTableCatch(SharedValidator *this,Location *loc,TableCatch *catch_)

{
  bool bVar1;
  Result rhs;
  char *pcVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  value_type *__x;
  Type local_98;
  Var local_90;
  Enum local_44;
  undefined1 local_40 [8];
  TagType tag_type;
  TableCatch *catch__local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  __x = (value_type *)0x0;
  tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)catch_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  TagType::TagType((TagType *)local_40);
  (this->expr_loc_).filename._M_len = (loc->filename)._M_len;
  (this->expr_loc_).filename._M_str = (loc->filename)._M_str;
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = *(undefined8 *)((long)&loc->field_1 + 8);
  bVar1 = TableCatch::IsCatchAll
                    ((TableCatch *)
                     tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    Var::Var(&local_90,
             (Var *)(tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_44 = (Enum)CheckTagIndex(this,&local_90,(TagType *)local_40);
    __x = (value_type *)(ulong)local_44;
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_44);
    Var::~Var(&local_90);
  }
  bVar1 = TableCatch::IsRef((TableCatch *)
                            tag_type.params.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  __c = extraout_EDX;
  if (bVar1) {
    Type::Type(&local_98,ExnRef);
    __x = &local_98;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_40,__x);
    __c = extraout_EDX_00;
  }
  pcVar2 = Var::index((Var *)(tag_type.params.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 0xd),(char *)__x,__c);
  rhs = TypeChecker::OnTryTableCatch(&this->typechecker_,(TypeVector *)local_40,(Index)pcVar2);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  TagType::~TagType((TagType *)local_40);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTryTableCatch(const Location& loc,
                                        const TableCatch& catch_) {
  Result result = Result::Ok;
  TagType tag_type;
  expr_loc_ = loc;
  if (!catch_.IsCatchAll()) {
    result |= CheckTagIndex(catch_.tag, &tag_type);
  }
  if (catch_.IsRef()) {
    tag_type.params.push_back(Type::ExnRef);
  }
  result |=
      typechecker_.OnTryTableCatch(tag_type.params, catch_.target.index());
  return result;
}